

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walLimitSize(Wal *pWal,i64 nMax)

{
  long lVar1;
  uint uVar2;
  sqlite3_file *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int rx;
  i64 sz;
  uint in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0xaaaaaaaa;
  sqlite3BeginBenignMalloc();
  uVar2 = sqlite3OsFileSize(in_RSI,(i64 *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
  if ((uVar2 == 0) && ((long)in_RSI < -0x5555555555555556)) {
    uVar2 = sqlite3OsTruncate(in_RSI,(ulong)in_stack_ffffffffffffffd8);
  }
  sqlite3EndBenignMalloc();
  if (uVar2 != 0) {
    sqlite3_log((int)(ulong)uVar2,"cannot limit WAL size: %s",*(undefined8 *)(in_RDI + 0x80));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void walLimitSize(Wal *pWal, i64 nMax){
  i64 sz;
  int rx;
  sqlite3BeginBenignMalloc();
  rx = sqlite3OsFileSize(pWal->pWalFd, &sz);
  if( rx==SQLITE_OK && (sz > nMax ) ){
    rx = sqlite3OsTruncate(pWal->pWalFd, nMax);
  }
  sqlite3EndBenignMalloc();
  if( rx ){
    sqlite3_log(rx, "cannot limit WAL size: %s", pWal->zWalName);
  }
}